

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::SimplePathIntegrator::Li
          (SimplePathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *param_5)

{
  size_t sVar1;
  pointer pLVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ushort uVar7;
  undefined1 auVar8 [16];
  Vector3f wiRender;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  SamplerHandle *pSVar18;
  pointer pLVar19;
  PrimitiveHandle *this_00;
  uintptr_t uVar20;
  HaltonSampler *pHVar21;
  DebugMLTSampler *pDVar22;
  long in_FS_OFFSET;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Float FVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar74 [56];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar50 [64];
  undefined1 auVar52 [64];
  Tuple2<pbrt::Point2,_float> u2;
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar56 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 auVar64 [64];
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar72 [64];
  undefined4 uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar87 [56];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar85 [64];
  float fVar88;
  float fVar90;
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 in_ZMM6 [64];
  SampledSpectrum SVar92;
  SampledSpectrum SVar93;
  Vector3f w;
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f woRender_01;
  Vector3f wiRender_00;
  SampledSpectrum b;
  undefined1 local_398 [16];
  DispatchSplit<9> local_379;
  undefined1 local_378 [16];
  SampledSpectrum f;
  Vector3f local_358 [2];
  bool bStack_33c;
  undefined8 local_340;
  SampledSpectrum beta;
  float local_318;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined4 local_2ec;
  undefined1 local_2e8 [16];
  float local_2d8;
  float fStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  bool *local_2c0;
  SamplerHandle *local_2b8;
  PrimitiveHandle *local_2b0;
  SimplePathIntegrator *local_2a8;
  ScratchBuffer *local_2a0;
  SamplerHandle local_298;
  CameraHandle local_290;
  undefined8 local_288;
  ulong local_280;
  optional<pbrt::LightLiSample> ls;
  undefined4 uStack_1d4;
  BSDF bsdf;
  optional<pbrt::ShapeIntersection> si;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar38 [64];
  undefined1 auVar51 [64];
  undefined1 auVar73 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_17 [56];
  undefined1 extraout_var_18 [56];
  undefined1 extraout_var_19 [56];
  undefined1 extraout_var_20 [56];
  undefined1 extraout_var_21 [56];
  undefined1 extraout_var_22 [56];
  undefined1 extraout_var_23 [56];
  undefined1 extraout_var_24 [56];
  undefined1 extraout_var_25 [56];
  undefined1 extraout_var_26 [56];
  undefined1 extraout_var_27 [56];
  undefined1 auVar80 [64];
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  
  this_00 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  iVar14 = 0;
  beta.values.values[0] = 1.0;
  beta.values.values[1] = 1.0;
  beta.values.values[2] = 1.0;
  beta.values.values[3] = 1.0;
  local_2c0 = &ray->hasDifferentials;
  _local_308 = ZEXT816(0);
  local_398._0_4_ = 1;
  local_2b8 = sampler;
  local_2b0 = this_00;
  local_2a8 = this;
  local_2a0 = scratchBuffer;
  do {
    if ((beta.values.values[0] == 0.0) && (!NAN(beta.values.values[0]))) {
      uVar15 = 0xffffffffffffffff;
      do {
        if (uVar15 == 2) goto LAB_003e0b3f;
        fVar31 = beta.values.values[uVar15 + 2];
        uVar15 = uVar15 + 1;
      } while ((fVar31 == 0.0) && (!NAN(fVar31)));
      if (2 < uVar15) break;
    }
    *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
    if (((this_00->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      si.optionalValue._0_64_ = ZEXT464(0) << 0x20;
      si.set = false;
      si._257_7_ = 0;
      si.optionalValue._64_64_ = si.optionalValue._0_64_;
      si.optionalValue._128_64_ = si.optionalValue._0_64_;
      si.optionalValue._192_64_ = si.optionalValue._0_64_;
LAB_003dfc80:
      if ((this->sampleLights != true) ||
         ((local_398 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        pLVar19 = (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                  infiniteLights.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pLVar2 = *(pointer *)
                  ((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                          infiniteLights.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data + 8);
        while (this = local_2a8, this_00 = local_2b0, pLVar19 != pLVar2) {
          uVar15 = (pLVar19->
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   ).bits;
          auVar25 = ZEXT816(0) << 0x40;
          auVar27 = ZEXT816(0) << 0x40;
          uVar13 = (uint)(ushort)(uVar15 >> 0x30);
          if (6 < uVar13) {
            uVar13 = uVar13 - 6;
            auVar25 = in_ZMM6._0_16_;
            if (uVar13 < 2) {
              auVar74 = ZEXT856(0);
              auVar87 = ZEXT856(0);
              in_ZMM6 = ZEXT1664(auVar25);
              SVar92 = UniformInfiniteLight::Le
                                 ((UniformInfiniteLight *)(uVar15 & 0xffffffffffff),&ray->super_Ray,
                                  lambda);
              auVar81._0_8_ = SVar92.values.values._8_8_;
              auVar81._8_56_ = auVar87;
              auVar27 = auVar81._0_16_;
              auVar40._0_8_ = SVar92.values.values._0_8_;
              auVar40._8_56_ = auVar74;
              auVar25 = auVar40._0_16_;
            }
            else if (uVar13 == 2) {
              auVar74 = ZEXT856(0);
              auVar87 = ZEXT856(0);
              in_ZMM6 = ZEXT1664(auVar25);
              SVar92 = ImageInfiniteLight::Le
                                 ((ImageInfiniteLight *)(uVar15 & 0xffffffffffff),&ray->super_Ray,
                                  lambda);
              auVar82._0_8_ = SVar92.values.values._8_8_;
              auVar82._8_56_ = auVar87;
              auVar27 = auVar82._0_16_;
              auVar41._0_8_ = SVar92.values.values._0_8_;
              auVar41._8_56_ = auVar74;
              auVar25 = auVar41._0_16_;
            }
            else {
              auVar74 = ZEXT856(0);
              auVar87 = ZEXT856(0);
              in_ZMM6 = ZEXT1664(auVar25);
              SVar92 = PortalImageInfiniteLight::Le
                                 ((PortalImageInfiniteLight *)(uVar15 & 0xffffffffffff),
                                  &ray->super_Ray,lambda);
              auVar83._0_8_ = SVar92.values.values._8_8_;
              auVar83._8_56_ = auVar87;
              auVar27 = auVar83._0_16_;
              auVar42._0_8_ = SVar92.values.values._0_8_;
              auVar42._8_56_ = auVar74;
              auVar25 = auVar42._0_16_;
            }
          }
          auVar25 = vmovlhps_avx(auVar25,auVar27);
          auVar27._0_4_ = auVar25._0_4_ * beta.values.values[0];
          auVar27._4_4_ = auVar25._4_4_ * beta.values.values[1];
          auVar27._8_4_ = auVar25._8_4_ * beta.values.values[2];
          auVar27._12_4_ = auVar25._12_4_ * beta.values.values[3];
          auVar25 = *(undefined1 (*) [16])(lambda->pdf).values;
          pLVar19 = pLVar19 + 1;
          uVar15 = vcmpps_avx512vl(auVar25,_DAT_0054e010,4);
          auVar25 = vdivps_avx512vl(auVar27,auVar25);
          local_308._0_4_ =
               (float)((uint)((byte)uVar15 & 1) * auVar25._0_4_) + (float)local_308._0_4_;
          local_308._4_4_ =
               (float)((uint)((byte)(uVar15 >> 1) & 1) * auVar25._4_4_) + (float)local_308._4_4_;
          fStack_300 = (float)((uint)((byte)(uVar15 >> 2) & 1) * auVar25._8_4_) + fStack_300;
          fStack_2fc = (float)((uint)((byte)(uVar15 >> 3) & 1) * auVar25._12_4_) + fStack_2fc;
        }
      }
      bVar24 = true;
    }
    else {
      in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
      PrimitiveHandle::Intersect(&si,this_00,&ray->super_Ray,INFINITY);
      if ((si._256_8_ & 1) == 0) goto LAB_003dfc80;
      if ((this->sampleLights != true) ||
         ((local_398 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        uVar15._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        uVar15._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar25._0_8_ = uVar15 ^ 0x8000000080000000;
        auVar25._8_4_ = 0x80000000;
        auVar25._12_4_ = 0x80000000;
        auVar76._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar76._4_4_ = 0x80000000;
        auVar76._8_4_ = 0x80000000;
        auVar76._12_4_ = 0x80000000;
        w.super_Tuple3<pbrt::Vector3,_float>.z = auVar76._0_4_;
        w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar25._0_8_;
        w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar25._0_8_ >> 0x20);
        auVar87 = ZEXT856(auVar76._8_8_);
        auVar74 = ZEXT856(auVar25._8_8_);
        SVar92 = SurfaceInteraction::Le((SurfaceInteraction *)&si,w,lambda);
        auVar80._0_8_ = SVar92.values.values._8_8_;
        auVar80._8_56_ = auVar87;
        auVar38._0_8_ = SVar92.values.values._0_8_;
        auVar38._8_56_ = auVar74;
        auVar25 = vmovlhps_avx(auVar38._0_16_,auVar80._0_16_);
        auVar26._0_4_ = auVar25._0_4_ * beta.values.values[0];
        auVar26._4_4_ = auVar25._4_4_ * beta.values.values[1];
        auVar26._8_4_ = auVar25._8_4_ * beta.values.values[2];
        auVar26._12_4_ = auVar25._12_4_ * beta.values.values[3];
        auVar25 = *(undefined1 (*) [16])(lambda->pdf).values;
        uVar15 = vcmpps_avx512vl(auVar25,_DAT_0054e010,4);
        auVar25 = vdivps_avx512vl(auVar26,auVar25);
        local_308._0_4_ = (float)((uint)((byte)uVar15 & 1) * auVar25._0_4_) + (float)local_308._0_4_
        ;
        local_308._4_4_ =
             (float)((uint)((byte)(uVar15 >> 1) & 1) * auVar25._4_4_) + (float)local_308._4_4_;
        fStack_300 = (float)((uint)((byte)(uVar15 >> 2) & 1) * auVar25._8_4_) + fStack_300;
        fStack_2fc = (float)((uint)((byte)(uVar15 >> 3) & 1) * auVar25._12_4_) + fStack_2fc;
      }
      pSVar18 = local_2b8;
      iVar12 = iVar14 + 1;
      bVar24 = true;
      bVar23 = iVar14 != this->maxDepth;
      iVar14 = iVar12;
      if (bVar23) {
        local_290.
        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
        .bits = (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                 )(this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                  .bits;
        local_298.
        super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
        .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 )(local_2b8->
                  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
        SurfaceInteraction::GetBSDF
                  (&bsdf,(SurfaceInteraction *)&si,ray,lambda,&local_290,local_2a0,&local_298);
        if (((ulong)bsdf.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                    .bits & 0xffffffffffff) == 0) {
          if (si.set == false) {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
          }
          SurfaceInteraction::SkipIntersection
                    ((SurfaceInteraction *)&si,ray,(Float)si.optionalValue._248_4_);
          iVar12 = 2;
        }
        else {
          local_2d8 = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          fStack_2d4 = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          uStack_2d0 = 0x80000000;
          uStack_2cc = 0x80000000;
          local_2e8._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          local_2e8._4_4_ = 0x80000000;
          local_2e8._8_4_ = 0x80000000;
          local_2e8._12_4_ = 0x80000000;
          if (this->sampleLights == true) {
            ls.optionalValue.__align =
                 (anon_struct_8_0_00000001_for___align)
                 (pSVar18->
                 super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            FVar28 = DispatchSplit<9>::operator()
                               ((DispatchSplit<9> *)&f,&ls,(ulong)ls.optionalValue.__align >> 0x30);
            auVar25 = in_ZMM6._0_16_;
            sVar1 = (this->lightSampler).lights.nStored;
            if (sVar1 != 0) {
              auVar27 = vcvtusi2ss_avx512f(auVar25,sVar1);
              iVar12 = (int)sVar1 + -1;
              uVar15 = (pSVar18->
                       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       ).bits;
              iVar16 = (int)(FVar28 * auVar27._0_4_);
              if (iVar16 <= iVar12) {
                iVar12 = iVar16;
              }
              uVar20 = (this->lightSampler).lights.ptr[iVar12].
                       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                       .bits;
              uVar7 = (ushort)(uVar15 >> 0x30);
              uVar13 = (uint)uVar7;
              if (uVar15 < 0x5000000000000) {
                if (uVar13 < 3) {
                  if (uVar13 == 2) {
                    auVar39._0_8_ =
                         StratifiedSampler::Get2D((StratifiedSampler *)(uVar15 & 0xffffffffffff));
                    auVar39._8_56_ = extraout_var_07;
                    auVar26 = auVar39._0_16_;
                  }
                  else {
                    auVar46._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar15 & 0xffffffffffff))
                    ;
                    auVar46._8_56_ = extraout_var_10;
                    auVar26 = auVar46._0_16_;
                  }
                }
                else {
                  pHVar21 = (HaltonSampler *)(uVar15 & 0xffffffffffff);
                  if ((uVar13 & 6) == 2) {
                    local_378._0_8_ = uVar20;
                    iVar12 = pHVar21->dimension;
                    if (0x3e6 < pHVar21->dimension) {
                      iVar12 = 2;
                    }
                    pHVar21->dimension = iVar12 + 2;
                    FVar28 = HaltonSampler::SampleDimension(pHVar21,iVar12);
                    uVar20 = local_378._0_8_;
                    auVar44._0_4_ = HaltonSampler::SampleDimension(pHVar21,iVar12 + 1);
                    auVar44._4_60_ = extraout_var;
                    auVar26 = auVar44._0_16_;
                    auVar77._4_4_ = extraout_XMM0_Db;
                    auVar77._0_4_ = FVar28;
                    auVar77._8_4_ = extraout_XMM0_Dc;
                    auVar77._12_4_ = extraout_XMM0_Dd;
LAB_003dfeac:
                    auVar26 = vinsertps_avx(auVar77,auVar26,0x10);
                  }
                  else {
                    auVar48._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar21);
                    auVar48._8_56_ = extraout_var_12;
                    auVar26 = auVar48._0_16_;
                  }
                }
              }
              else {
                uVar17 = uVar7 - 4;
                if (uVar17 < 3) {
                  if (uVar17 == 2) {
                    auVar43._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)(uVar15 & 0xffffffffffff))
                    ;
                    auVar43._8_56_ = extraout_var_08;
                    auVar26 = auVar43._0_16_;
                  }
                  else {
                    auVar47._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar15 & 0xffffffffffff));
                    auVar47._8_56_ = extraout_var_11;
                    auVar26 = auVar47._0_16_;
                  }
                }
                else if (uVar13 - 6 < 2) {
                  auVar45._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar15 & 0xffffffffffff))
                  ;
                  auVar45._8_56_ = extraout_var_09;
                  auVar26 = auVar45._0_16_;
                }
                else {
                  pDVar22 = (DebugMLTSampler *)(uVar15 & 0xffffffffffff);
                  if (uVar13 - 6 != 2) {
                    local_378._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                    local_378._4_4_ = extraout_XMM0_Db_00;
                    local_378._8_4_ = extraout_XMM0_Dc_00;
                    local_378._12_4_ = extraout_XMM0_Dd_00;
                    auVar50._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                    auVar50._4_60_ = extraout_var_00;
                    auVar26 = auVar50._0_16_;
                    auVar77 = local_378;
                    goto LAB_003dfeac;
                  }
                  auVar49._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar22);
                  auVar49._8_56_ = extraout_var_13;
                  auVar26 = auVar49._0_16_;
                }
              }
              auVar42 = si.optionalValue._0_64_;
              uVar75 = si.optionalValue._48_4_;
              uVar11 = si.optionalValue._40_8_;
              uStack_1d4 = si.optionalValue._128_4_;
              local_58 = *(undefined8 *)(lambda->lambda).values;
              uStack_50 = *(undefined8 *)((lambda->lambda).values + 2);
              uStack_48 = *(undefined8 *)(lambda->pdf).values;
              uStack_40 = *(undefined8 *)((lambda->pdf).values + 2);
              local_358[1].super_Tuple3<pbrt::Vector3,_float>._4_8_ =
                   CONCAT44(uStack_1d4,si.optionalValue._48_4_);
              local_340 = si.optionalValue._132_8_;
              local_288 = vmovlps_avx(auVar26);
              local_2ec = 1;
              local_358[0].super_Tuple3<pbrt::Vector3,_float>.x = (float)si.optionalValue._16_4_;
              local_358[0].super_Tuple3<pbrt::Vector3,_float>.y = (float)si.optionalValue._20_4_;
              f.values.values._0_8_ = si.optionalValue.__align;
              f.values.values[2] = (float)si.optionalValue._8_4_;
              f.values.values[3] = (float)si.optionalValue._12_4_;
              local_358[0].super_Tuple3<pbrt::Vector3,_float>.z = (float)si.optionalValue._40_4_;
              local_358[1].super_Tuple3<pbrt::Vector3,_float>.x = (float)si.optionalValue._44_4_;
              in_ZMM6 = ZEXT1664(auVar25);
              local_280 = uVar20;
              si.optionalValue._0_64_ = auVar42;
              DispatchSplit<9>::operator()
                        (&ls,&local_379,&local_280,uVar20 >> 0x30,uVar11,uVar75,&f,&local_288,
                         &local_58,&local_2ec);
              uVar75 = ls.optionalValue._24_4_;
              pSVar18 = local_2b8;
              if (ls.set == true) {
                if (((float)ls.optionalValue._0_4_ == 0.0) && (!NAN((float)ls.optionalValue._0_4_)))
                {
                  uVar15 = 0xffffffffffffffff;
                  do {
                    if (uVar15 == 2) goto LAB_003e01ef;
                    fVar31 = *(float *)((long)&ls.optionalValue + uVar15 * 4 + 8);
                    uVar15 = uVar15 + 1;
                  } while ((fVar31 == 0.0) && (!NAN(fVar31)));
                  if (2 < uVar15) goto LAB_003e01ef;
                }
                if (0.0 < (float)ls.optionalValue._28_4_) {
                  local_378._4_4_ = ls.optionalValue._20_4_;
                  local_378._0_4_ = ls.optionalValue._16_4_;
                  wiRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)ls.optionalValue._20_4_;
                  wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)ls.optionalValue._16_4_;
                  wiRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)ls.optionalValue._24_4_;
                  woRender.super_Tuple3<pbrt::Vector3,_float>.y = fStack_2d4;
                  woRender.super_Tuple3<pbrt::Vector3,_float>.x = local_2d8;
                  local_378._8_8_ = 0;
                  woRender.super_Tuple3<pbrt::Vector3,_float>.z = local_2e8._0_4_;
                  auVar87 = ZEXT856((ulong)local_2e8._8_8_);
                  auVar74 = ZEXT856(CONCAT44(uStack_2cc,uStack_2d0));
                  SVar92 = BSDF::f(&bsdf,woRender,wiRender,Radiance);
                  auVar84._0_8_ = SVar92.values.values._8_8_;
                  auVar84._8_56_ = auVar87;
                  auVar51._0_8_ = SVar92.values.values._0_8_;
                  auVar51._8_56_ = auVar74;
                  auVar25 = vmovlhps_avx(auVar51._0_16_,auVar84._0_16_);
                  auVar26 = vmovshdup_avx(local_378);
                  auVar76 = ZEXT416((uint)((float)uVar75 * (float)si.optionalValue._136_4_));
                  auVar26 = vfmadd132ss_fma(auVar26,auVar76,ZEXT416((uint)si.optionalValue._132_4_))
                  ;
                  auVar76 = vfmsub213ss_fma(ZEXT416((uint)uVar75),
                                            ZEXT416((uint)si.optionalValue._136_4_),auVar76);
                  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(auVar26._0_4_ + auVar76._0_4_)),local_378
                                            ,ZEXT416((uint)si.optionalValue._128_4_));
                  auVar78._0_4_ = auVar26._0_4_;
                  auVar78._4_4_ = auVar78._0_4_;
                  auVar78._8_4_ = auVar78._0_4_;
                  auVar78._12_4_ = auVar78._0_4_;
                  auVar6._8_4_ = 0x7fffffff;
                  auVar6._0_8_ = 0x7fffffff7fffffff;
                  auVar6._12_4_ = 0x7fffffff;
                  auVar26 = vandps_avx512vl(auVar78,auVar6);
                  f.values.values[0] = auVar26._0_4_ * auVar25._0_4_;
                  f.values.values[1] = auVar26._4_4_ * auVar25._4_4_;
                  f.values.values[3] = auVar26._12_4_ * auVar25._12_4_;
                  f.values.values[2] = auVar26._8_4_ * auVar25._8_4_;
                  if ((f.values.values[0] == 0.0) && (!NAN(f.values.values[0]))) {
                    uVar15 = 0xffffffffffffffff;
                    do {
                      if (uVar15 == 2) goto LAB_003e01ef;
                      fVar31 = f.values.values[uVar15 + 2];
                      uVar15 = uVar15 + 1;
                    } while ((fVar31 == 0.0) && (!NAN(fVar31)));
                    if (2 < uVar15) goto LAB_003e01ef;
                  }
                  if (ls.set == false) {
                    LogFatal<char_const(&)[4]>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                               ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
                  }
                  bVar24 = Integrator::Unoccluded
                                     ((Integrator *)this,(Interaction *)&si,
                                      (Interaction *)((long)&ls.optionalValue + 0x20));
                  if (bVar24) {
                    if (ls.set == false) {
                      LogFatal<char_const(&)[4]>
                                (Fatal,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                 ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
                    }
                    fVar30 = f.values.values[0] * beta.values.values[0] *
                             (float)ls.optionalValue._0_4_;
                    fVar29 = f.values.values[1] * beta.values.values[1] *
                             (float)ls.optionalValue._4_4_;
                    auVar26 = CONCAT412(f.values.values[3] * beta.values.values[3] *
                                        (float)ls.optionalValue._12_4_,
                                        CONCAT48(f.values.values[2] * beta.values.values[2] *
                                                 (float)ls.optionalValue._8_4_,
                                                 CONCAT44(fVar29,fVar30)));
                    fVar31 = (1.0 / auVar27._0_4_) * (float)ls.optionalValue._28_4_;
                    fVar88 = fVar31 * (lambda->pdf).values[0];
                    fVar90 = fVar31 * (lambda->pdf).values[1];
                    auVar25 = CONCAT412(fVar31 * (lambda->pdf).values[3],
                                        CONCAT48(fVar31 * (lambda->pdf).values[2],
                                                 CONCAT44(fVar90,fVar88)));
                    auVar25 = vshufpd_avx(auVar25,auVar25,1);
                    auVar27 = vshufpd_avx(auVar26,auVar26,1);
                    SVar92.values.values._8_8_ = auVar27._0_8_;
                    SVar92.values.values[0] = fVar30;
                    SVar92.values.values[1] = fVar29;
                    auVar87 = ZEXT856(auVar27._8_8_);
                    auVar74 = ZEXT856(auVar26._8_8_);
                    b.values.values._8_8_ = auVar25._0_8_;
                    b.values.values[0] = fVar88;
                    b.values.values[1] = fVar90;
                    SVar92 = SafeDiv(SVar92,b);
                    auVar85._0_8_ = SVar92.values.values._8_8_;
                    auVar85._8_56_ = auVar87;
                    auVar52._0_8_ = SVar92.values.values._0_8_;
                    auVar52._8_56_ = auVar74;
                    auVar25 = vunpcklpd_avx(auVar52._0_16_,auVar85._0_16_);
                    local_308._4_4_ = auVar25._4_4_ + (float)local_308._4_4_;
                    local_308._0_4_ = auVar25._0_4_ + (float)local_308._0_4_;
                    fStack_300 = auVar25._8_4_ + fStack_300;
                    fStack_2fc = auVar25._12_4_ + fStack_2fc;
                  }
                }
              }
            }
          }
LAB_003e01ef:
          auVar91 = in_ZMM6._0_16_;
          if (this->sampleBSDF == true) {
            ls.optionalValue.__align =
                 (anon_struct_8_0_00000001_for___align)
                 (pSVar18->
                 super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            FVar28 = DispatchSplit<9>::operator()
                               ((DispatchSplit<9> *)&f,&ls,(ulong)ls.optionalValue.__align >> 0x30);
            uVar15 = (pSVar18->
                     super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     ).bits;
            uVar7 = (ushort)(uVar15 >> 0x30);
            uVar13 = (uint)uVar7;
            if (uVar15 < 0x5000000000000) {
              if (uVar13 < 3) {
                if (uVar13 == 2) {
                  u2 = (Tuple2<pbrt::Point2,_float>)
                       StratifiedSampler::Get2D((StratifiedSampler *)(uVar15 & 0xffffffffffff));
                }
                else {
                  u2 = (Tuple2<pbrt::Point2,_float>)
                       RandomSampler::Get2D((RandomSampler *)(uVar15 & 0xffffffffffff));
                }
              }
              else {
                pHVar21 = (HaltonSampler *)(uVar15 & 0xffffffffffff);
                if ((uVar13 & 6) == 2) {
                  iVar12 = pHVar21->dimension;
                  if (0x3e6 < pHVar21->dimension) {
                    iVar12 = 2;
                  }
                  pHVar21->dimension = iVar12 + 2;
                  local_378._0_4_ = HaltonSampler::SampleDimension(pHVar21,iVar12);
                  local_378._4_4_ = extraout_XMM0_Db_01;
                  local_378._8_4_ = extraout_XMM0_Dc_01;
                  local_378._12_4_ = extraout_XMM0_Dd_01;
                  auVar56._0_4_ = HaltonSampler::SampleDimension(pHVar21,iVar12 + 1);
                  auVar56._4_60_ = extraout_var_01;
                  auVar25 = auVar56._0_16_;
LAB_003e0679:
                  auVar25 = vinsertps_avx(local_378,auVar25,0x10);
                  u2 = auVar25._0_8_;
                }
                else {
                  u2 = (Tuple2<pbrt::Point2,_float>)
                       PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar21);
                }
              }
            }
            else {
              uVar17 = uVar7 - 4;
              if (uVar17 < 3) {
                if (uVar17 == 2) {
                  u2 = (Tuple2<pbrt::Point2,_float>)
                       ZSobolSampler::Get2D((ZSobolSampler *)(uVar15 & 0xffffffffffff));
                }
                else {
                  u2 = (Tuple2<pbrt::Point2,_float>)
                       SobolSampler::Get2D((SobolSampler *)(uVar15 & 0xffffffffffff));
                }
              }
              else if (uVar13 - 6 < 2) {
                u2 = (Tuple2<pbrt::Point2,_float>)
                     PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar15 & 0xffffffffffff));
              }
              else {
                pDVar22 = (DebugMLTSampler *)(uVar15 & 0xffffffffffff);
                if (uVar13 - 6 != 2) {
                  local_378._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                  local_378._4_4_ = extraout_XMM0_Db_03;
                  local_378._8_4_ = extraout_XMM0_Dc_03;
                  local_378._12_4_ = extraout_XMM0_Dd_03;
                  auVar64._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                  auVar64._4_60_ = extraout_var_03;
                  auVar25 = auVar64._0_16_;
                  goto LAB_003e0679;
                }
                u2 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar22);
              }
            }
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = fStack_2d4;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = local_2d8;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = local_2e8._0_4_;
            BSDF::Sample_f((optional<pbrt::BSDFSample> *)&f,&bsdf,woRender_00,FVar28,(Point2f)u2,
                           Radiance,All);
            uVar11 = local_358[1].super_Tuple3<pbrt::Vector3,_float>._4_8_;
            bVar24 = bStack_33c;
            iVar12 = 3;
            if (bStack_33c != false) {
              auVar25 = vfmadd132ss_fma(ZEXT416((uint)si.optionalValue._132_4_),
                                        ZEXT416((uint)((float)si.optionalValue._136_4_ *
                                                      local_358[0].
                                                      super_Tuple3<pbrt::Vector3,_float>.z)),
                                        ZEXT416((uint)local_358[0].
                                                      super_Tuple3<pbrt::Vector3,_float>.y));
              auVar27 = vfmsub213ss_fma(ZEXT416((uint)local_358[0].
                                                      super_Tuple3<pbrt::Vector3,_float>.z),
                                        ZEXT416((uint)si.optionalValue._136_4_),
                                        ZEXT416((uint)((float)si.optionalValue._136_4_ *
                                                      local_358[0].
                                                      super_Tuple3<pbrt::Vector3,_float>.z)));
              auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ + auVar27._0_4_)),
                                        ZEXT416((uint)si.optionalValue._128_4_),
                                        ZEXT416((uint)local_358[0].
                                                      super_Tuple3<pbrt::Vector3,_float>.x));
              uVar75 = auVar25._0_4_;
              auVar32._4_4_ = uVar75;
              auVar32._0_4_ = uVar75;
              auVar32._8_4_ = uVar75;
              auVar32._12_4_ = uVar75;
              auVar3._8_4_ = 0x7fffffff;
              auVar3._0_8_ = 0x7fffffff7fffffff;
              auVar3._12_4_ = 0x7fffffff;
              auVar25 = vandps_avx512vl(auVar32,auVar3);
              auVar33._0_4_ = auVar25._0_4_ * f.values.values[0];
              auVar33._4_4_ = auVar25._4_4_ * f.values.values[1];
              auVar33._8_4_ = auVar25._8_4_ * f.values.values[2];
              auVar33._12_4_ = auVar25._12_4_ * f.values.values[3];
              auVar4._4_4_ = local_358[1].super_Tuple3<pbrt::Vector3,_float>.x;
              auVar4._0_4_ = local_358[1].super_Tuple3<pbrt::Vector3,_float>.x;
              auVar4._8_4_ = local_358[1].super_Tuple3<pbrt::Vector3,_float>.x;
              auVar4._12_4_ = local_358[1].super_Tuple3<pbrt::Vector3,_float>.x;
              auVar25 = vdivps_avx512vl(auVar33,auVar4);
              beta.values.values[0] = auVar25._0_4_ * beta.values.values[0];
              beta.values.values[1] = auVar25._4_4_ * beta.values.values[1];
              beta.values.values[2] = auVar25._8_4_ * beta.values.values[2];
              beta.values.values[3] = auVar25._12_4_ * beta.values.values[3];
              Interaction::SpawnRay((RayDifferential *)&ls,(Interaction *)&si,local_358);
              local_398._1_3_ = 0;
              local_398[0] = (byte)uVar11 >> 4;
              (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
                   (float)ls.optionalValue._12_4_;
              (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
                   (float)ls.optionalValue._16_4_;
              *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                   CONCAT44(ls.optionalValue._24_4_,ls.optionalValue._20_4_);
              *(anon_struct_8_0_00000001_for___align *)
               &(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float> = ls.optionalValue.__align;
              *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                   CONCAT44(ls.optionalValue._12_4_,ls.optionalValue._8_4_);
              (ray->super_Ray).medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = ls.optionalValue._32_8_;
              auVar9._4_8_ = ls.optionalValue._64_8_;
              auVar9._0_4_ = ls.optionalValue._60_4_;
              auVar9._12_20_ = ls.optionalValue._72_20_;
              *(undefined1 (*) [32])(local_2c0 + 0x14) = auVar9;
              *(undefined8 *)local_2c0 = ls.optionalValue._40_8_;
              *(undefined8 *)(local_2c0 + 8) = ls.optionalValue._48_8_;
              (((Point3f *)(local_2c0 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x =
                   (float)ls.optionalValue._56_4_;
              (((Point3f *)(local_2c0 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y =
                   (float)ls.optionalValue._60_4_;
              *(undefined8 *)(local_2c0 + 0x18) = ls.optionalValue._64_8_;
              iVar12 = 0;
            }
            auVar91 = in_ZMM6._0_16_;
            uVar75 = local_398._0_4_;
            if (bVar24 == false) goto LAB_003e0b2c;
          }
          else {
            f.values.values[0] = 0.0;
            f.values.values[1] = 0.0;
            f.values.values._8_8_ = f.values.values._8_8_ & 0xffffffff00000000;
            bVar24 = BSDF::HasReflection(&bsdf);
            if ((bVar24) && (bVar24 = BSDF::HasTransmission(&bsdf), bVar24)) {
              uVar15 = (pSVar18->
                       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       ).bits;
              uVar7 = (ushort)(uVar15 >> 0x30);
              uVar13 = (uint)uVar7;
              if (uVar15 < 0x5000000000000) {
                if (uVar13 < 3) {
                  if (uVar13 == 2) {
                    auVar53._0_8_ =
                         StratifiedSampler::Get2D((StratifiedSampler *)(uVar15 & 0xffffffffffff));
                    auVar53._8_56_ = extraout_var_14;
                    auVar25 = auVar53._0_16_;
                  }
                  else {
                    auVar68._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar15 & 0xffffffffffff))
                    ;
                    auVar68._8_56_ = extraout_var_24;
                    auVar25 = auVar68._0_16_;
                  }
                }
                else {
                  pHVar21 = (HaltonSampler *)(uVar15 & 0xffffffffffff);
                  if ((uVar13 & 6) == 2) {
                    iVar12 = pHVar21->dimension;
                    if (0x3e6 < pHVar21->dimension) {
                      iVar12 = 2;
                    }
                    pHVar21->dimension = iVar12 + 2;
                    local_398._0_4_ = HaltonSampler::SampleDimension(pHVar21,iVar12);
                    local_398._4_4_ = extraout_XMM0_Db_04;
                    local_398._8_4_ = extraout_XMM0_Dc_04;
                    local_398._12_4_ = extraout_XMM0_Dd_04;
                    auVar65._0_4_ = HaltonSampler::SampleDimension(pHVar21,iVar12 + 1);
                    auVar65._4_60_ = extraout_var_04;
                    auVar25 = auVar65._0_16_;
LAB_003e0962:
                    auVar25 = vinsertps_avx(local_398,auVar25,0x10);
                  }
                  else {
                    auVar70._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar21);
                    auVar70._8_56_ = extraout_var_26;
                    auVar25 = auVar70._0_16_;
                  }
                }
              }
              else {
                uVar17 = uVar7 - 4;
                if (uVar17 < 3) {
                  if (uVar17 == 2) {
                    auVar59._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)(uVar15 & 0xffffffffffff))
                    ;
                    auVar59._8_56_ = extraout_var_18;
                    auVar25 = auVar59._0_16_;
                  }
                  else {
                    auVar69._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar15 & 0xffffffffffff));
                    auVar69._8_56_ = extraout_var_25;
                    auVar25 = auVar69._0_16_;
                  }
                }
                else if (uVar13 - 6 < 2) {
                  auVar66._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar15 & 0xffffffffffff))
                  ;
                  auVar66._8_56_ = extraout_var_23;
                  auVar25 = auVar66._0_16_;
                }
                else {
                  pDVar22 = (DebugMLTSampler *)(uVar15 & 0xffffffffffff);
                  if (uVar13 - 6 != 2) {
                    local_398._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                    local_398._4_4_ = extraout_XMM0_Db_06;
                    local_398._8_4_ = extraout_XMM0_Dc_06;
                    local_398._12_4_ = extraout_XMM0_Dd_06;
                    auVar72._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                    auVar72._4_60_ = extraout_var_06;
                    auVar25 = auVar72._0_16_;
                    goto LAB_003e0962;
                  }
                  auVar71._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar22);
                  auVar71._8_56_ = extraout_var_27;
                  auVar25 = auVar71._0_16_;
                }
              }
              auVar26 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar25,ZEXT416(0xc0000000));
              auVar27 = vfnmadd213ss_fma(auVar26,auVar26,SUB6416(ZEXT464(0x3f800000),0));
              auVar27 = vmaxss_avx(auVar27,ZEXT416(0));
              auVar27 = vsqrtss_avx(auVar27,auVar27);
              auVar25 = vmovshdup_avx(auVar25);
              fVar31 = auVar25._0_4_ * 6.2831855;
              fVar30 = cosf(fVar31);
              local_378 = ZEXT416((uint)(fVar30 * auVar27._0_4_));
              fVar31 = sinf(fVar31);
              local_318 = auVar26._0_4_;
              auVar25 = vinsertps_avx(local_378,ZEXT416((uint)(fVar31 * auVar27._0_4_)),0x10);
              f.values.values._0_8_ = vmovlps_avx(auVar25);
              local_398 = SUB6416(ZEXT464(0x3da2f983),0);
LAB_003e09f6:
              f.values.values[2] = local_318;
            }
            else {
              uVar15 = (pSVar18->
                       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       ).bits;
              uVar7 = (ushort)(uVar15 >> 0x30);
              uVar13 = (uint)uVar7;
              if (uVar15 < 0x5000000000000) {
                if (uVar13 < 3) {
                  if (uVar13 == 2) {
                    auVar54._0_8_ =
                         StratifiedSampler::Get2D((StratifiedSampler *)(uVar15 & 0xffffffffffff));
                    auVar54._8_56_ = extraout_var_15;
                    auVar25 = auVar54._0_16_;
                  }
                  else {
                    auVar60._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar15 & 0xffffffffffff))
                    ;
                    auVar60._8_56_ = extraout_var_19;
                    auVar25 = auVar60._0_16_;
                  }
                }
                else {
                  pHVar21 = (HaltonSampler *)(uVar15 & 0xffffffffffff);
                  if ((uVar13 & 6) == 2) {
                    iVar12 = pHVar21->dimension;
                    if (0x3e6 < pHVar21->dimension) {
                      iVar12 = 2;
                    }
                    pHVar21->dimension = iVar12 + 2;
                    local_398._0_4_ = HaltonSampler::SampleDimension(pHVar21,iVar12);
                    local_398._4_4_ = extraout_XMM0_Db_02;
                    local_398._8_4_ = extraout_XMM0_Dc_02;
                    local_398._12_4_ = extraout_XMM0_Dd_02;
                    auVar57._0_4_ = HaltonSampler::SampleDimension(pHVar21,iVar12 + 1);
                    auVar57._4_60_ = extraout_var_02;
                    auVar25 = auVar57._0_16_;
LAB_003e0717:
                    auVar25 = vinsertps_avx(local_398,auVar25,0x10);
                  }
                  else {
                    auVar62._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar21);
                    auVar62._8_56_ = extraout_var_21;
                    auVar25 = auVar62._0_16_;
                  }
                }
              }
              else {
                uVar17 = uVar7 - 4;
                if (uVar17 < 3) {
                  if (uVar17 == 2) {
                    auVar55._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)(uVar15 & 0xffffffffffff))
                    ;
                    auVar55._8_56_ = extraout_var_16;
                    auVar25 = auVar55._0_16_;
                  }
                  else {
                    auVar61._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar15 & 0xffffffffffff));
                    auVar61._8_56_ = extraout_var_20;
                    auVar25 = auVar61._0_16_;
                  }
                }
                else if (uVar13 - 6 < 2) {
                  auVar58._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar15 & 0xffffffffffff))
                  ;
                  auVar58._8_56_ = extraout_var_17;
                  auVar25 = auVar58._0_16_;
                }
                else {
                  pDVar22 = (DebugMLTSampler *)(uVar15 & 0xffffffffffff);
                  if (uVar13 - 6 != 2) {
                    local_398._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                    local_398._4_4_ = extraout_XMM0_Db_05;
                    local_398._8_4_ = extraout_XMM0_Dc_05;
                    local_398._12_4_ = extraout_XMM0_Dd_05;
                    auVar67._0_4_ = DebugMLTSampler::Get1D(pDVar22);
                    auVar67._4_60_ = extraout_var_05;
                    auVar25 = auVar67._0_16_;
                    goto LAB_003e0717;
                  }
                  auVar63._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar22);
                  auVar63._8_56_ = extraout_var_22;
                  auVar25 = auVar63._0_16_;
                }
              }
              fVar30 = auVar25._0_4_;
              auVar27 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar30 * fVar30)),ZEXT416(0));
              auVar27 = vsqrtss_avx(auVar27,auVar27);
              auVar25 = vmovshdup_avx(auVar25);
              fVar31 = auVar25._0_4_ * 6.2831855;
              fVar29 = cosf(fVar31);
              local_378 = ZEXT416((uint)(fVar29 * auVar27._0_4_));
              fVar31 = sinf(fVar31);
              auVar25 = vinsertps_avx(local_378,ZEXT416((uint)(fVar31 * auVar27._0_4_)),0x10);
              f.values.values._0_8_ = vmovlps_avx(auVar25);
              f.values.values[2] = fVar30;
              bVar24 = BSDF::HasReflection(&bsdf);
              if (bVar24) {
                auVar8._4_4_ = fStack_2d4;
                auVar8._0_4_ = local_2d8;
                auVar8._8_4_ = uStack_2d0;
                auVar8._12_4_ = uStack_2cc;
                auVar25 = vmovshdup_avx(auVar8);
                auVar27 = ZEXT416((uint)((float)si.optionalValue._48_4_ * local_2e8._0_4_));
                auVar25 = vfmadd213ss_fma(auVar25,ZEXT416((uint)si.optionalValue._44_4_),auVar27);
                auVar27 = vfmsub231ss_fma(auVar27,ZEXT416((uint)si.optionalValue._48_4_),local_2e8);
                auVar34._8_8_ = 0;
                auVar34._0_4_ = f.values.values[0];
                auVar34._4_4_ = f.values.values[1];
                auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ + auVar27._0_4_)),
                                          ZEXT416((uint)si.optionalValue._40_4_),auVar8);
                auVar25 = vmovshdup_avx(auVar34);
                auVar91 = vfmadd213ss_fma(auVar25,ZEXT416((uint)si.optionalValue._44_4_),
                                          ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                        f.values.values[2])));
                auVar25 = vfmsub213ss_fma(ZEXT416((uint)si.optionalValue._48_4_),
                                          ZEXT416((uint)f.values.values[2]),
                                          ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                        f.values.values[2])));
                auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar91._0_4_ + auVar25._0_4_)),auVar34,
                                          ZEXT416((uint)si.optionalValue._40_4_));
                if (0.0 <= auVar27._0_4_ * auVar25._0_4_) goto LAB_003e084b;
LAB_003e08ee:
                auVar35._0_8_ = f.values.values._0_8_ ^ 0x8000000080000000;
                auVar35._8_4_ = 0x80000000;
                local_318 = -f.values.values[2];
                auVar35._12_4_ = 0x80000000;
                f.values.values._0_8_ = vmovlps_avx(auVar35);
                local_398 = SUB6416(ZEXT464(0x3e22f983),0);
                goto LAB_003e09f6;
              }
LAB_003e084b:
              bVar24 = BSDF::HasTransmission(&bsdf);
              if (bVar24) {
                auVar91._4_4_ = fStack_2d4;
                auVar91._0_4_ = local_2d8;
                auVar91._8_4_ = uStack_2d0;
                auVar91._12_4_ = uStack_2cc;
                auVar25 = vmovshdup_avx(auVar91);
                auVar26 = ZEXT416((uint)((float)si.optionalValue._48_4_ * local_2e8._0_4_));
                auVar27 = vfmsub213ss_fma(local_2e8,ZEXT416((uint)si.optionalValue._48_4_),auVar26);
                auVar25 = vfmadd213ss_fma(auVar25,ZEXT416((uint)si.optionalValue._44_4_),auVar26);
                auVar36._8_8_ = 0;
                auVar36._0_4_ = f.values.values[0];
                auVar36._4_4_ = f.values.values[1];
                auVar26 = vfmsub213ss_fma(ZEXT416((uint)si.optionalValue._48_4_),
                                          ZEXT416((uint)f.values.values[2]),
                                          ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                        f.values.values[2])));
                auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ + auVar27._0_4_)),
                                          ZEXT416((uint)si.optionalValue._40_4_),auVar91);
                auVar25 = vmovshdup_avx(auVar36);
                auVar25 = vfmadd213ss_fma(auVar25,ZEXT416((uint)si.optionalValue._44_4_),
                                          ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                        f.values.values[2])));
                auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ + auVar26._0_4_)),auVar36,
                                          ZEXT416((uint)si.optionalValue._40_4_));
                if (0.0 < auVar27._0_4_ * auVar25._0_4_) goto LAB_003e08ee;
              }
              local_398 = SUB6416(ZEXT464(0x3e22f983),0);
              local_318 = f.values.values[2];
            }
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.y = fStack_2d4;
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.x = local_2d8;
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.z = local_2e8._0_4_;
            auVar87 = ZEXT856((ulong)local_2e8._8_8_);
            auVar74 = ZEXT856(CONCAT44(uStack_2cc,uStack_2d0));
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = local_318;
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x = f.values.values[0];
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y = f.values.values[1];
            SVar92 = BSDF::f(&bsdf,woRender_01,wiRender_00,Radiance);
            auVar86._0_8_ = SVar92.values.values._8_8_;
            auVar86._8_56_ = auVar87;
            auVar73._0_8_ = SVar92.values.values._0_8_;
            auVar73._8_56_ = auVar74;
            auVar25 = vmovlhps_avx(auVar73._0_16_,auVar86._0_16_);
            auVar27 = vfmadd132ss_fma(ZEXT416((uint)si.optionalValue._132_4_),
                                      ZEXT416((uint)((float)si.optionalValue._136_4_ *
                                                    f.values.values[2])),
                                      ZEXT416((uint)f.values.values[1]));
            auVar26 = vfmsub213ss_fma(ZEXT416((uint)f.values.values[2]),
                                      ZEXT416((uint)si.optionalValue._136_4_),
                                      ZEXT416((uint)((float)si.optionalValue._136_4_ *
                                                    f.values.values[2])));
            auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ + auVar26._0_4_)),
                                      ZEXT416((uint)si.optionalValue._128_4_),
                                      ZEXT416((uint)f.values.values[0]));
            auVar89._4_4_ = local_398._0_4_;
            auVar89._0_4_ = local_398._0_4_;
            auVar89._8_4_ = local_398._0_4_;
            auVar89._12_4_ = local_398._0_4_;
            auVar79._0_4_ = auVar27._0_4_;
            auVar79._4_4_ = auVar79._0_4_;
            auVar79._8_4_ = auVar79._0_4_;
            auVar79._12_4_ = auVar79._0_4_;
            auVar5._8_4_ = 0x7fffffff;
            auVar5._0_8_ = 0x7fffffff7fffffff;
            auVar5._12_4_ = 0x7fffffff;
            auVar27 = vandps_avx512vl(auVar79,auVar5);
            auVar37._0_4_ = auVar27._0_4_ * auVar25._0_4_;
            auVar37._4_4_ = auVar27._4_4_ * auVar25._4_4_;
            auVar37._8_4_ = auVar27._8_4_ * auVar25._8_4_;
            auVar37._12_4_ = auVar27._12_4_ * auVar25._12_4_;
            auVar25 = vdivps_avx(auVar37,auVar89);
            beta.values.values[0] = auVar25._0_4_ * beta.values.values[0];
            beta.values.values[1] = auVar25._4_4_ * beta.values.values[1];
            beta.values.values[2] = auVar25._8_4_ * beta.values.values[2];
            beta.values.values[3] = auVar25._12_4_ * beta.values.values[3];
            Interaction::SpawnRay((RayDifferential *)&ls,(Interaction *)&si,(Vector3f *)&f);
            uVar75 = 0;
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)ls.optionalValue._12_4_
            ;
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = (float)ls.optionalValue._16_4_
            ;
            *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                 CONCAT44(ls.optionalValue._24_4_,ls.optionalValue._20_4_);
            *(anon_struct_8_0_00000001_for___align *)
             &(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float> = ls.optionalValue.__align;
            *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                 CONCAT44(ls.optionalValue._12_4_,ls.optionalValue._8_4_);
            (ray->super_Ray).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = ls.optionalValue._32_8_;
            auVar10._4_8_ = ls.optionalValue._64_8_;
            auVar10._0_4_ = ls.optionalValue._60_4_;
            auVar10._12_20_ = ls.optionalValue._72_20_;
            *(undefined1 (*) [32])(local_2c0 + 0x14) = auVar10;
            *(undefined8 *)local_2c0 = ls.optionalValue._40_8_;
            *(undefined8 *)(local_2c0 + 8) = ls.optionalValue._48_8_;
            (((Point3f *)(local_2c0 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x =
                 (float)ls.optionalValue._56_4_;
            (((Point3f *)(local_2c0 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y =
                 (float)ls.optionalValue._60_4_;
            *(undefined8 *)(local_2c0 + 0x18) = ls.optionalValue._64_8_;
          }
          in_ZMM6 = ZEXT1664(auVar91);
          FVar28 = SampledSpectrum::y(&beta,lambda);
          ls.optionalValue._0_4_ = FVar28;
          f.values.values._0_8_ = f.values.values._0_8_ & 0xffffffff00000000;
          if (FVar28 < 0.0) {
            LogFatal<char_const(&)[15],char_const(&)[4],char_const(&)[15],float&,char_const(&)[4],float&>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                       ,0x1e4,"Check failed: %s >= %s with %s = %s, %s = %s",
                       (char (*) [15])"beta.y(lambda)",(char (*) [4])"0.f",
                       (char (*) [15])"beta.y(lambda)",(float *)&ls,(char (*) [4])"0.f",(float *)&f)
            ;
          }
          iVar12 = 0;
          local_398._0_4_ = uVar75;
        }
LAB_003e0b2c:
        bVar24 = iVar12 == 3;
      }
    }
  } while (!bVar24);
LAB_003e0b3f:
  auVar25 = vshufpd_avx(_local_308,_local_308,1);
  SVar93.values.values._0_8_ = local_308;
  SVar93.values.values._8_8_ = auVar25._0_8_;
  return (SampledSpectrum)SVar93.values.values;
}

Assistant:

SampledSpectrum SimplePathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                         SamplerHandle sampler,
                                         ScratchBuffer &scratchBuffer,
                                         VisibleSurface *) const {
    // Estimate radiance along ray using simple path tracing
    SampledSpectrum L(0.f), beta(1.f);
    bool specularBounce = true;
    int depth = 0;
    while (beta) {
        // Find next _SimplePathIntegrator_ path vertex and accumulate contribution
        // Intersect _ray_ with scene
        pstd::optional<ShapeIntersection> si = Intersect(ray);

        // Account for infinite lights if ray has no intersection
        if (!si) {
            if (!sampleLights || specularBounce)
                for (const auto &light : infiniteLights)
                    L += SafeDiv(beta * light.Le(ray, lambda), lambda.PDF());
            break;
        }

        // Account for emsisive surface if light wasn't sampled
        SurfaceInteraction &isect = si->intr;
        if (!sampleLights || specularBounce)
            L += SafeDiv(beta * isect.Le(-ray.d, lambda), lambda.PDF());

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Sample direct illumination if _sampleLights_ is true
        Vector3f wo = -ray.d;
        if (sampleLights) {
            pstd::optional<SampledLight> sampledLight =
                lightSampler.Sample(sampler.Get1D());
            if (sampledLight) {
                // Sample point on _sampledLight_ to estimate direct illumination
                Point2f uLight = sampler.Get2D();
                pstd::optional<LightLiSample> ls =
                    sampledLight->light.SampleLi(isect, uLight, lambda);
                if (ls && ls->L && ls->pdf > 0) {
                    // Evaluate BSDF for light and possibly add scattered radiance
                    Vector3f wi = ls->wi;
                    SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n);
                    if (f && Unoccluded(isect, ls->pLight))
                        L += SafeDiv(beta * f * ls->L,
                                     sampledLight->pdf * ls->pdf * lambda.PDF());
                }
            }
        }

        // Sample outoing direction at intersection to continue path
        if (sampleBSDF) {
            // Sample BSDF for new path direction
            Float u = sampler.Get1D();
            pstd::optional<BSDFSample> bs = bsdf.Sample_f(wo, u, sampler.Get2D());
            if (!bs)
                break;
            beta *= bs->f * AbsDot(bs->wi, isect.shading.n) / bs->pdf;
            specularBounce = bs->IsSpecular();
            ray = isect.SpawnRay(bs->wi);

        } else {
            // Uniformly sample sphere or hemisphere to get new path direction
            Float pdf;
            Vector3f wi;
            if (bsdf.HasReflection() && bsdf.HasTransmission()) {
                wi = SampleUniformSphere(sampler.Get2D());
                pdf = UniformSpherePDF();
            } else {
                wi = SampleUniformHemisphere(sampler.Get2D());
                pdf = UniformHemispherePDF();
                if (bsdf.HasReflection() && Dot(wo, isect.n) * Dot(wi, isect.n) < 0)
                    wi = -wi;
                else if (bsdf.HasTransmission() &&
                         Dot(wo, isect.n) * Dot(wi, isect.n) > 0)
                    wi = -wi;
            }
            beta *= bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n) / pdf;
            specularBounce = false;
            ray = isect.SpawnRay(wi);
        }

        CHECK_GE(beta.y(lambda), 0.f);
        DCHECK(!IsInf(beta.y(lambda)));
    }
    return L;
}